

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O1

string * cppcms::b64url::encode(string *__return_storage_ptr__,string *input)

{
  ulong uVar1;
  uchar *begin;
  uint uVar2;
  vector<char,_std::allocator<char>_> buf;
  allocator_type local_42;
  value_type_conflict local_41;
  vector<char,_std::allocator<char>_> local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar1 = input->_M_string_length;
  uVar2 = (int)(uVar1 / 3) << 2;
  if (uVar1 % 3 == 2) {
    uVar2 = uVar2 | 3;
  }
  else if (uVar1 % 3 == 1) {
    uVar2 = uVar2 | 2;
  }
  if (uVar2 != 0) {
    begin = (uchar *)(input->_M_dataplus)._M_p;
    local_41 = '\0';
    std::vector<char,_std::allocator<char>_>::vector(&local_40,(long)(int)uVar2,&local_41,&local_42)
    ;
    encode(begin,begin + uVar1,
           (uchar *)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               (ulong)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    if ((uchar *)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CPPCMS_API encode(std::string const &input)
{
	std::string result;
	size_t enc_size = encoded_size(input.size());
	if(enc_size == 0)
		return result;
	unsigned char const *begin = reinterpret_cast<unsigned char const *>(input.c_str());
	unsigned char const *end = begin + input.size();
	std::vector<char> buf(enc_size,0);
	unsigned char *outbuf =  reinterpret_cast<unsigned char *>(&buf[0]);
	encode(begin,end,outbuf);
	result.assign(&buf[0],enc_size);
	return result;
}